

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::CollectTargetDepends(cmComputeTargetDepends *this,int depender_index)

{
  cmGeneratorTarget *this_00;
  size_t this_01;
  cmLinkImplementation *this_02;
  string *name;
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  reference ppcVar4;
  ulong uVar5;
  cmake *this_03;
  reference __x;
  reference __x_00;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar6;
  cmLinkItem *litem;
  iterator __end1_1;
  iterator __begin1_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *__range1_1;
  cmListFileBacktrace local_2e8;
  cmLinkItem local_2d8;
  undefined1 local_2a0 [8];
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *tutils;
  cmLinkImplItem *lib;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range2_1;
  cmListFileBacktrace local_218;
  cmLinkItem local_208;
  cmLinkImplementation *local_1d0;
  cmLinkImplementation *impl;
  undefined1 local_1c0 [24];
  string local_1a8;
  undefined8 local_188;
  undefined1 local_180 [16];
  undefined1 local_170;
  cmListFileBacktrace local_168;
  cmLinkItem local_158;
  value_type *local_120;
  cmLinkItem *objItem;
  string *local_f8;
  string *objLib;
  cmSourceFile *o;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  string *it;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  cmGeneratorTarget *depender;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  this_00 = *ppcVar3;
  TVar2 = cmGeneratorTarget::GetType(this_00);
  if (TVar2 != INTERFACE_LIBRARY) {
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
               &configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    cmMakefile::GetConfigurations
              (&local_88,this_00->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,true);
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68);
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
    it = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&it), bVar1) {
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
      cmGeneratorTarget::GetExternalObjects
                (this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                         &__range2,
                 (string *)
                 objectFiles.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          &__range2);
      o = (cmSourceFile *)
          std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                    ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     &__range2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                         *)&o), bVar1) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&__end2);
        objLib = (string *)*ppcVar4;
        cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)&objItem,(cmSourceFile *)objLib);
        local_f8 = (string *)&objItem;
        uVar5 = std::__cxx11::string::empty();
        name = local_f8;
        if ((uVar5 & 1) == 0) {
          local_168.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_168.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmListFileBacktrace::cmListFileBacktrace(&local_168);
          cmGeneratorTarget::ResolveLinkItem(&local_158,this_00,name,&local_168);
          cmListFileBacktrace::~cmListFileBacktrace(&local_168);
          local_120 = &local_158;
          pVar6 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                            ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                             &configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_120);
          local_188 = pVar6.first._M_node;
          local_180[0] = pVar6.second;
          local_180._8_8_ = local_188;
          local_170 = local_180[0];
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_005c0dbd:
            impl._4_4_ = 0;
          }
          else {
            TVar2 = cmGeneratorTarget::GetType(this_00);
            if ((((TVar2 == EXECUTABLE) ||
                 (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == STATIC_LIBRARY)) ||
                (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == SHARED_LIBRARY)) ||
               ((TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == MODULE_LIBRARY ||
                (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == OBJECT_LIBRARY)))) {
              cmTarget::AddUtility(this_00->Target,local_f8,(cmMakefile *)0x0);
              goto LAB_005c0dbd;
            }
            this_03 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,
                       "Only executables and libraries may reference target objects.",
                       (allocator<char> *)(local_1c0 + 0x17));
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1c0);
            cmake::IssueMessage(this_03,FATAL_ERROR,&local_1a8,(cmListFileBacktrace *)local_1c0);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1c0);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x17));
            impl._4_4_ = 1;
          }
          cmLinkItem::~cmLinkItem(&local_158);
          if (impl._4_4_ == 0) goto LAB_005c0def;
        }
        else {
LAB_005c0def:
          impl._4_4_ = 0;
        }
        std::__cxx11::string::~string((string *)&objItem);
        if (impl._4_4_ != 0) goto LAB_005c1057;
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&__end2);
      }
      local_1d0 = cmGeneratorTarget::GetLinkImplementation
                            (this_00,(string *)
                                     objectFiles.
                                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_218.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_218.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_218);
      cmLinkItem::cmLinkItem(&local_208,this_00,&local_218);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                 &configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
      cmLinkItem::~cmLinkItem(&local_208);
      cmListFileBacktrace::~cmListFileBacktrace(&local_218);
      this_02 = local_1d0;
      __end2_1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                           ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_1d0);
      lib = (cmLinkImplItem *)
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                 *)&lib), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
              ::operator*(&__end2_1);
        pVar6 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                          ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                           &configs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           &__x->super_cmLinkItem);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          AddTargetDepend(this,depender_index,&__x->super_cmLinkItem,true);
          AddInterfaceDepends(this,depender_index,&__x->super_cmLinkItem,
                              (string *)
                              objectFiles.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *
                              )&configs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __gnu_cxx::
        __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
        ::operator++(&__end2_1);
      }
      impl._4_4_ = 0;
LAB_005c1057:
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
      if (impl._4_4_ != 0) goto LAB_005c109d;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    impl._4_4_ = 0;
LAB_005c109d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
               &configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (impl._4_4_ == 0) {
      emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)cmGeneratorTarget::GetUtilityItems(this_00);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_2a0);
      local_2e8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2e8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_2e8);
      cmLinkItem::cmLinkItem(&local_2d8,this_00,&local_2e8);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_2a0,
                 &local_2d8);
      cmLinkItem::~cmLinkItem(&local_2d8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_2e8);
      this_01 = emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end1_1 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                           ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                            emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      litem = (cmLinkItem *)
              std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end
                        ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                         this_01);
      while (bVar1 = std::operator!=(&__end1_1,(_Self *)&litem), bVar1) {
        __x_00 = std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&__end1_1);
        pVar6 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                          ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                           local_2a0,__x_00);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          AddTargetDepend(this,depender_index,__x_00,false);
        }
        std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&__end1_1);
      }
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_2a0);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargetDepends(int depender_index)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (depender->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return;
  }

  // Loop over all targets linked directly in all configs.
  // We need to make targets depend on the union of all config-specific
  // dependencies in all targets, because the generated build-systems can't
  // deal with config-specific dependencies.
  {
    std::set<cmLinkItem> emitted;

    std::vector<std::string> configs;
    depender->Makefile->GetConfigurations(configs);
    if (configs.empty()) {
      configs.emplace_back();
    }
    for (std::string const& it : configs) {
      std::vector<cmSourceFile const*> objectFiles;
      depender->GetExternalObjects(objectFiles, it);
      for (cmSourceFile const* o : objectFiles) {
        std::string const& objLib = o->GetObjectLibrary();
        if (!objLib.empty()) {
          cmLinkItem const& objItem =
            depender->ResolveLinkItem(objLib, cmListFileBacktrace());
          if (emitted.insert(objItem).second) {
            if (depender->GetType() != cmStateEnums::EXECUTABLE &&
                depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
                depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
                depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
                depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
              this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
                MessageType::FATAL_ERROR,
                "Only executables and libraries may reference target objects.",
                depender->GetBacktrace());
              return;
            }
            const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(
              objLib);
          }
        }
      }

      cmLinkImplementation const* impl = depender->GetLinkImplementation(it);

      // A target should not depend on itself.
      emitted.insert(cmLinkItem(depender, cmListFileBacktrace()));
      for (cmLinkImplItem const& lib : impl->Libraries) {
        // Don't emit the same library twice for this target.
        if (emitted.insert(lib).second) {
          this->AddTargetDepend(depender_index, lib, true);
          this->AddInterfaceDepends(depender_index, lib, it, emitted);
        }
      }
    }
  }

  // Loop over all utility dependencies.
  {
    std::set<cmLinkItem> const& tutils = depender->GetUtilityItems();
    std::set<cmLinkItem> emitted;
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, cmListFileBacktrace()));
    for (cmLinkItem const& litem : tutils) {
      // Don't emit the same utility twice for this target.
      if (emitted.insert(litem).second) {
        this->AddTargetDepend(depender_index, litem, false);
      }
    }
  }
}